

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQPOMDP.cpp
# Opt level: O0

void __thiscall
FactoredQLastTimeStepOrQPOMDP::FactoredQLastTimeStepOrQPOMDP
          (FactoredQLastTimeStepOrQPOMDP *this,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  sp_counted_base *psVar1;
  undefined8 in_RSI;
  shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *in_RDI;
  pointer_____offset_0x88___ *pu;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  element_type *in_stack_ffffffffffffffd0;
  
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)in_RDI);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface
            ((QFunctionForDecPOMDPInterface *)in_RDI,&PTR_PTR_00d08af0);
  pu = &VTT;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)&in_RDI->pn,
             &PTR_construction_vtable_152__00d08b00);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            ((FactoredQLastTimeStepOrElse *)in_stack_ffffffffffffffd0,
             (void **)CONCAT17(in_stack_ffffffffffffffcf,
                               CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),in_RDI
            );
  in_RDI->px = (element_type *)0xd08888;
  in_RDI->px = (element_type *)0xd08888;
  in_RDI->px = (element_type *)0xd08888;
  (in_RDI->pn).pi_ = (sp_counted_base *)(vtable + 0x1d0);
  (in_RDI->pn).pi_ = (sp_counted_base *)(vtable + 0x1d0);
  psVar1 = (sp_counted_base *)operator_new(0x60);
  boost::shared_ptr<PlanningUnitDecPOMDPDiscrete_const>::
  shared_ptr<PlanningUnitFactoredDecPOMDPDiscrete_const>
            ((shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)&stack0xffffffffffffffd0,in_RSI);
  QPOMDP::QPOMDP((QPOMDP *)in_RDI,(shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)pu);
  in_RDI[5].pn.pi_ = psVar1;
  boost::shared_ptr<const_PlanningUnitDecPOMDPDiscrete>::~shared_ptr
            ((shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)0x8dc356);
  return;
}

Assistant:

FactoredQLastTimeStepOrQPOMDP::
FactoredQLastTimeStepOrQPOMDP(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QPOMDP=new QPOMDP(puf);
}